

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::markDirty<QRegion>
          (QWidgetRepaintManager *this,QRegion *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  QDebug *pQVar4;
  QWidgetPrivate *pQVar5;
  ulong uVar6;
  int in_ECX;
  QWidgetRepaintManager *in_RDX;
  QRegion *in_RSI;
  QDebug *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  bool eventAlreadyPosted_1;
  bool eventAlreadyPosted;
  QRect translatedRect;
  QPoint offset;
  QRect effectiveWidgetRect;
  QRect widgetRect;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QWidgetPrivate *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  QWidget *in_stack_fffffffffffffe98;
  QWidgetPrivate *in_stack_fffffffffffffea0;
  QSize *asize;
  QWidgetPrivate *in_stack_fffffffffffffea8;
  QWidgetRepaintManager *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  QRect local_118;
  QRegion local_108 [2];
  undefined1 in_stack_ffffffffffffff10 [16];
  undefined1 local_b0 [24];
  QPoint local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [48];
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetPainting();
  anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (QLoggingCategory *)in_stack_fffffffffffffe88);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3ab564);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94,(char *)in_stack_fffffffffffffe88,(char *)0x3ab57d);
    QMessageLogger::info();
    pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffea8,(char *)in_RSI);
    QDebug::QDebug(&local_48,pQVar4);
    ::operator<<((QDebug *)&local_40,(QRegion *)&local_48);
    pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffea8,(char *)in_RSI);
    QDebug::QDebug(&local_38,pQVar4);
    ::operator<<(in_stack_ffffffffffffff10._0_8_,local_108[2].d);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffea8,(char *)in_RSI);
    pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffea8,(char *)in_RSI);
    QDebug::QDebug(&local_28,pQVar4);
    ::operator<<(in_RDI,(UpdateTime)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    local_10 = 0;
  }
  QWidget::d_func((QWidget *)0x3ab6cc);
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(in_stack_fffffffffffffea0);
  local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80._0_16_ =
       (undefined1  [16])
       widgetRectFor((QWidget *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (QRegion *)in_stack_fffffffffffffe88);
  QWidget::d_func((QWidget *)0x3ab71b);
  bVar1 = QWidgetPrivate::shouldPaintOnScreen(in_stack_fffffffffffffe88);
  if (bVar1) {
    QWidget::d_func((QWidget *)0x3ab736);
    uVar6 = QRegion::isEmpty();
    if ((uVar6 & 1) == 0) {
      pQVar5 = QWidget::d_func((QWidget *)0x3ab795);
      uVar6 = qt_region_strictContains((QRegion *)&pQVar5->dirty,(QRect *)local_80);
      if ((uVar6 & 1) == 0) {
        QWidget::d_func((QWidget *)0x3ab7dd);
        bVar3 = QRegion::isEmpty();
        bVar3 = (bVar3 ^ 0xff) & 1;
        pQVar5 = QWidget::d_func((QWidget *)0x3ab808);
        QRegion::operator+=(&pQVar5->dirty,in_RSI);
        if (((bVar3 & 1) == 0) || (in_ECX == 0)) {
          sendUpdateRequest(in_RDX,(QWidget *)CONCAT44(in_ECX,in_R8D),
                            CONCAT13(bVar3,CONCAT12(in_stack_fffffffffffffec6,
                                                    in_stack_fffffffffffffec4)));
        }
      }
      else if (in_ECX == 0) {
        sendUpdateRequest(in_RDX,(QWidget *)(ulong)in_R8D,
                          CONCAT13(in_stack_fffffffffffffec7,
                                   CONCAT12(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4)));
      }
    }
    else {
      pQVar5 = QWidget::d_func((QWidget *)0x3ab75f);
      QRegion::operator=(&pQVar5->dirty,in_RSI);
      sendUpdateRequest(in_RDX,(QWidget *)CONCAT44(in_ECX,in_R8D),
                        CONCAT13(in_stack_fffffffffffffec7,
                                 CONCAT12(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4)));
    }
  }
  else {
    pQVar5 = QWidgetPrivate::get((QWidget *)0x3ab84c);
    if ((*(uint *)&pQVar5->field_0x250 >> 0x18 & 1) == 0) {
      local_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QWidget::d_func((QWidget *)0x3ab8da);
      local_90 = (undefined1  [16])
                 QWidgetPrivate::effectiveRectFor
                           (in_stack_fffffffffffffea8,(QRect *)in_stack_fffffffffffffea0);
      local_98 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      asize = (QSize *)in_RDI->stream;
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      local_98 = QWidget::mapTo((QWidget *)in_stack_fffffffffffffeb0,
                                (QWidget *)in_stack_fffffffffffffea8,(QPoint *)asize);
      local_b0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b0._0_16_ =
           (undefined1  [16])
           QRect::translated((QRect *)CONCAT44(in_ECX,in_R8D),
                             (QPoint *)
                             CONCAT17(in_stack_fffffffffffffec7,
                                      CONCAT16(in_stack_fffffffffffffec6,
                                               CONCAT24(in_stack_fffffffffffffec4,
                                                        in_stack_fffffffffffffec0))));
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      QWidget::size((QWidget *)in_stack_fffffffffffffe88);
      QRect::QRect((QRect *)in_stack_fffffffffffffeb0,(QPoint *)in_stack_fffffffffffffea8,asize);
      local_b0._0_16_ =
           (undefined1  [16])
           QRect::intersected((QRect *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
                              ,(QRect *)in_stack_fffffffffffffe88);
      uVar6 = qt_region_strictContains((QRegion *)(in_RDI + 2),(QRect *)local_b0);
      if ((uVar6 & 1) == 0) {
        if (in_R8D == 1) {
          bVar2 = QRegion::isEmpty();
          bVar3 = 1;
          if ((bVar2 & 1) != 0) {
            bVar3 = *(byte *)&in_RDI[0x11].stream;
          }
          bVar3 = bVar3 & 1;
          pQVar5 = QWidget::d_func((QWidget *)0x3aba9a);
          if (pQVar5->graphicsEffect == (QGraphicsEffect *)0x0) {
            QRegion::translated((QRegion *)in_stack_fffffffffffffea8,(QPoint *)asize);
            QRegion::operator+=((QRegion *)(in_RDI + 2),(QRegion *)local_108);
            QRegion::~QRegion(local_108);
          }
          else {
            QWidget::d_func((QWidget *)0x3abaae);
            join_0x00000010_0x00000000_ =
                 QWidgetPrivate::effectiveRectFor(in_stack_fffffffffffffea8,(QRegion *)asize);
            QRect::translated((QRect *)CONCAT44(in_ECX,in_R8D),
                              (QPoint *)
                              CONCAT17(in_stack_fffffffffffffec7,
                                       CONCAT16(bVar3,CONCAT24(in_stack_fffffffffffffec4,
                                                               in_stack_fffffffffffffec0))));
            QRegion::operator+=((QRegion *)(in_RDI + 2),(QRect *)&stack0xffffffffffffff10);
          }
          if (((bVar3 & 1) == 0) || (in_ECX == 0)) {
            sendUpdateRequest(in_RDX,(QWidget *)CONCAT44(in_ECX,in_R8D),
                              CONCAT13(in_stack_fffffffffffffec7,
                                       CONCAT12(bVar3,in_stack_fffffffffffffec4)));
          }
        }
        else {
          bVar1 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x3abb68);
          if (bVar1) {
            addDirtyWidget(in_stack_fffffffffffffeb0,(QWidget *)in_stack_fffffffffffffea8,
                           (QRegion *)asize);
            sendUpdateRequest(in_RDX,(QWidget *)CONCAT44(in_ECX,in_R8D),
                              CONCAT13(in_stack_fffffffffffffec7,
                                       CONCAT12(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4)
                                      ));
          }
          else {
            pQVar5 = QWidget::d_func((QWidget *)0x3abba2);
            if ((*(uint *)&pQVar5->field_0x250 >> 0x13 & 1) == 0) {
              addDirtyWidget(in_stack_fffffffffffffeb0,(QWidget *)in_stack_fffffffffffffea8,
                             (QRegion *)asize);
            }
            else {
              pQVar5 = QWidget::d_func((QWidget *)0x3abbc1);
              uVar6 = qt_region_strictContains((QRegion *)&pQVar5->dirty,(QRect *)local_90);
              if ((uVar6 & 1) == 0) {
                pQVar5 = QWidget::d_func((QWidget *)0x3abbe6);
                if (pQVar5->graphicsEffect == (QGraphicsEffect *)0x0) {
                  pQVar5 = QWidget::d_func((QWidget *)0x3abc44);
                  QRegion::operator+=(&pQVar5->dirty,in_RSI);
                }
                else {
                  QWidget::d_func((QWidget *)0x3abbfa);
                  local_118 = QWidgetPrivate::effectiveRectFor
                                        (in_stack_fffffffffffffea8,(QRegion *)asize);
                  pQVar5 = QWidget::d_func((QWidget *)0x3abc1b);
                  QRegion::operator+=(&pQVar5->dirty,(QRect *)&local_118);
                }
              }
            }
            if (in_ECX == 0) {
              sendUpdateRequest(in_RDX,(QWidget *)(ulong)in_R8D,
                                CONCAT13(in_stack_fffffffffffffec7,
                                         CONCAT12(in_stack_fffffffffffffec6,
                                                  in_stack_fffffffffffffec4)));
            }
          }
        }
      }
      else if (in_ECX == 0) {
        sendUpdateRequest(in_RDX,(QWidget *)(ulong)in_R8D,
                          CONCAT13(in_stack_fffffffffffffec7,
                                   CONCAT12(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4)));
      }
    }
    else {
      pQVar5 = QWidget::d_func((QWidget *)0x3ab867);
      if ((*(uint *)&pQVar5->field_0x250 >> 0x13 & 1) == 0) {
        addDirtyRenderToTextureWidget
                  ((QWidgetRepaintManager *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      if ((((ulong)in_RDI[0x11].stream & 1) == 0) || (in_ECX == 0)) {
        sendUpdateRequest(in_RDX,(QWidget *)CONCAT44(in_ECX,in_R8D),
                          CONCAT13(in_stack_fffffffffffffec7,
                                   CONCAT12(in_stack_fffffffffffffec6,in_stack_fffffffffffffec4)));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}